

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

int hydro_hash_update(hydro_hash_state *state,void *in_,size_t in_len)

{
  uint8_t *puVar1;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  long in_RDI;
  size_t i;
  size_t ps;
  size_t left;
  uint8_t *buf;
  uint8_t *in;
  uint8_t in_stack_ffffffffffffffbf;
  uint8_t *local_38;
  uint8_t *local_20;
  uint8_t *local_18;
  
  local_20 = in_RSI;
  local_18 = in_RDX;
  while (local_18 != (uint8_t *)0x0) {
    puVar1 = (uint8_t *)(long)(int)(0x10 - (uint)*(byte *)(in_RDI + 0x30));
    local_38 = local_18;
    if (puVar1 < local_18) {
      local_38 = puVar1;
    }
    for (puVar1 = (uint8_t *)0x0; puVar1 < local_38; puVar1 = puVar1 + 1) {
      puVar1[in_RDI + (ulong)*(byte *)(in_RDI + 0x30)] =
           puVar1[in_RDI + (ulong)*(byte *)(in_RDI + 0x30)] ^ local_20[(long)puVar1];
    }
    local_20 = local_38 + (long)local_20;
    local_18 = local_18 + -(long)local_38;
    *(char *)(in_RDI + 0x30) = *(char *)(in_RDI + 0x30) + (char)local_38;
    if (*(char *)(in_RDI + 0x30) == '\x10') {
      gimli_core_u8(puVar1,in_stack_ffffffffffffffbf);
      *(undefined1 *)(in_RDI + 0x30) = 0;
    }
  }
  return 0;
}

Assistant:

int
hydro_hash_update(hydro_hash_state *state, const void *in_, size_t in_len)
{
    const uint8_t *in  = (const uint8_t *) in_;
    uint8_t       *buf = (uint8_t *) (void *) state->state;
    size_t         left;
    size_t         ps;
    size_t         i;

    while (in_len > 0) {
        left = gimli_RATE - state->buf_off;
        if ((ps = in_len) > left) {
            ps = left;
        }
        for (i = 0; i < ps; i++) {
            buf[state->buf_off + i] ^= in[i];
        }
        in += ps;
        in_len -= ps;
        state->buf_off += (uint8_t) ps;
        if (state->buf_off == gimli_RATE) {
            gimli_core_u8(buf, 0);
            state->buf_off = 0;
        }
    }
    return 0;
}